

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

int archive_write_pax_options(archive_write *a,char *key,char *val)

{
  int iVar1;
  archive_string_conv *paVar2;
  archive_conflict *in_RDX;
  char *in_RSI;
  archive *in_RDI;
  int ret;
  pax *pax;
  char *charset;
  wchar_t local_4;
  
  charset = *(char **)&in_RDI[1].current_codepage;
  local_4 = L'\xffffffe7';
  iVar1 = strcmp(in_RSI,"hdrcharset");
  if (iVar1 == 0) {
    if ((in_RDX == (archive_conflict *)0x0) || ((char)in_RDX->magic == '\0')) {
      archive_set_error(in_RDI,-1,"pax: hdrcharset option needs a character-set name");
    }
    else {
      iVar1 = strcmp((char *)in_RDX,"BINARY");
      if ((iVar1 == 0) || (iVar1 = strcmp((char *)in_RDX,"binary"), iVar1 == 0)) {
        charset[0x78] = '\x01';
        charset[0x79] = '\0';
        charset[0x7a] = '\0';
        charset[0x7b] = '\0';
        local_4 = L'\0';
      }
      else {
        iVar1 = strcmp((char *)in_RDX,"UTF-8");
        if (iVar1 == 0) {
          paVar2 = archive_string_conversion_to_charset(in_RDX,charset,local_4);
          *(archive_string_conv **)(charset + 0x70) = paVar2;
          if (*(long *)(charset + 0x70) == 0) {
            local_4 = L'\xffffffe2';
          }
          else {
            local_4 = L'\0';
          }
        }
        else {
          archive_set_error(in_RDI,-1,"pax: invalid charset name");
        }
      }
    }
  }
  else {
    local_4 = L'\xffffffec';
  }
  return local_4;
}

Assistant:

static int
archive_write_pax_options(struct archive_write *a, const char *key,
    const char *val)
{
	struct pax *pax = (struct pax *)a->format_data;
	int ret = ARCHIVE_FAILED;

	if (strcmp(key, "hdrcharset")  == 0) {
		/*
		 * The character-set we can use are defined in
		 * IEEE Std 1003.1-2001
		 */
		if (val == NULL || val[0] == 0)
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "pax: hdrcharset option needs a character-set name");
		else if (strcmp(val, "BINARY") == 0 ||
		    strcmp(val, "binary") == 0) {
			/*
			 * Specify binary mode. We will not convert
			 * filenames, uname and gname to any charsets.
			 */
			pax->opt_binary = 1;
			ret = ARCHIVE_OK;
		} else if (strcmp(val, "UTF-8") == 0) {
			/*
			 * Specify UTF-8 character-set to be used for
			 * filenames. This is almost the test that
			 * running platform supports the string conversion.
			 * Especially libarchive_test needs this trick for
			 * its test.
			 */
			pax->sconv_utf8 = archive_string_conversion_to_charset(
			    &(a->archive), "UTF-8", 0);
			if (pax->sconv_utf8 == NULL)
				ret = ARCHIVE_FATAL;
			else
				ret = ARCHIVE_OK;
		} else
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "pax: invalid charset name");
		return (ret);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}